

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O1

KString * __thiscall
KDIS::PDU::Intercom_Control_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Intercom_Control_PDU *this)

{
  pointer pIVar1;
  KString *pKVar2;
  ostream *poVar3;
  ostream *poVar4;
  ulong uVar5;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  ushort uVar6;
  pointer pIVar7;
  KStringStream ss;
  KString local_428;
  KString *local_408;
  KString local_400;
  KString local_3e0;
  long *local_3c0;
  long local_3b8;
  long local_3b0 [2];
  KString local_3a0;
  KString local_380;
  KString local_360;
  undefined1 local_340 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [7];
  ios_base local_2c0 [264];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  Header7::GetAsString_abi_cxx11_(&local_360,&this->super_Header);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a8,local_360._M_dataplus._M_p,local_360._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"-Intercom Control PDU-\n",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"Control Type:                     ",0x22);
  DATA_TYPE::ENUMS::GetEnumAsStringControlType_abi_cxx11_
            (&local_380,(ENUMS *)(ulong)(byte)(this->super_Header).super_Header6.field_0x27,Value);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_380._M_dataplus._M_p,local_380._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  local_408 = __return_storage_ptr__;
  DATA_TYPE::CommunicationsChannelType::GetAsString_abi_cxx11_(&local_3a0,&this->m_CommChannelType);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Source Entity:\n",0xf);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_400,&this->m_SrcEnt);
  std::__cxx11::stringstream::stringstream((stringstream *)local_340);
  poVar3 = (ostream *)(local_340 + 0x10);
  local_428._M_dataplus._M_p._0_1_ = '\t';
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_428,1);
  if (local_400._M_string_length != 0) {
    uVar6 = 1;
    uVar5 = 0;
    do {
      local_428._M_dataplus._M_p._0_1_ = local_400._M_dataplus._M_p[uVar5];
      if ((local_400._M_string_length - 1 == uVar5) || ((char)local_428._M_dataplus._M_p != '\n')) {
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_428,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_428,1);
        local_428._M_dataplus._M_p._0_1_ = '\t';
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_428,1);
      }
      uVar5 = (ulong)uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar5 < local_400._M_string_length);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)local_340);
  std::ios_base::~ios_base(local_2c0);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)local_3c0,local_3b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"Source Communications Device ID:  ",0x22);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"Source Line ID:                   ",0x22);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"Transmit Priority:                ",0x22);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"Transmit Line State:              ",0x22);
  DATA_TYPE::ENUMS::GetEnumAsStringTransmitLineState_abi_cxx11_
            ((KString *)local_340,(ENUMS *)(ulong)this->m_ui8TransmitLineState,Value_00);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)local_340._0_8_,local_340._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"Command:                          ",0x22);
  DATA_TYPE::ENUMS::GetEnumAsStringLineStateCommand_abi_cxx11_
            (&local_428,(ENUMS *)(ulong)this->m_ui8Command,Value_01);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(char *)CONCAT71(local_428._M_dataplus._M_p._1_7_,
                                              (char)local_428._M_dataplus._M_p),
                      local_428._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Master Entity ID:\n",0x12);
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_3e0,&this->m_MstrEntID);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_3e0._M_dataplus._M_p,local_3e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"Master Communications Device ID:  ",0x22);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"Master Channel ID:                ",0x22);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"Intercom Parameter Length:        ",0x22);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_428._M_dataplus._M_p._1_7_,(char)local_428._M_dataplus._M_p) !=
      &local_428.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_428._M_dataplus._M_p._1_7_,(char)local_428._M_dataplus._M_p),
                    local_428.field_2._M_allocated_capacity + 1);
  }
  if ((ostream *)local_340._0_8_ != poVar3) {
    operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
  }
  if (local_3c0 != local_3b0) {
    operator_delete(local_3c0,local_3b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p,local_3a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  pIVar7 = (this->m_vICP).
           super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar1 = (this->m_vICP).
           super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pIVar7 != pIVar1) {
    do {
      (*(pIVar7->super_DataTypeBase)._vptr_DataTypeBase[2])(local_340,pIVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_340._0_8_,local_340._8_8_);
      if ((ostream *)local_340._0_8_ != poVar3) {
        operator_delete((void *)local_340._0_8_,local_330[0]._M_allocated_capacity + 1);
      }
      pIVar7 = pIVar7 + 1;
    } while (pIVar7 != pIVar1);
  }
  pKVar2 = local_408;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return pKVar2;
}

Assistant:

KString Intercom_Control_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Intercom Control PDU-\n"
       << "Control Type:                     " << GetEnumAsStringControlType( m_ui8CtrlTyp ) << "\n"
       << m_CommChannelType.GetAsString()
       << "Source Entity:\n"
       << IndentString( m_SrcEnt.GetAsString(), 1 )
       << "Source Communications Device ID:  " << m_ui16SrcCommDevID                << "\n"
       << "Source Line ID:                   " << ( KUINT16 )m_ui8SrcLineID         << "\n"
       << "Transmit Priority:                " << ( KUINT16 )m_ui8TransmitPriority  << "\n"
       << "Transmit Line State:              " << GetEnumAsStringTransmitLineState( m_ui8TransmitLineState ) << "\n"
       << "Command:                          " << GetEnumAsStringLineStateCommand( m_ui8Command )            << "\n"
       << "Master Entity ID:\n"
       << m_MstrEntID.GetAsString()
       << "Master Communications Device ID:  " << m_ui16MstrCommDeviceID            << "\n"
       << "Master Channel ID:                " << m_ui16MstrChannelID               << "\n"
       << "Intercom Parameter Length:        " << m_ui32IntrParamLen                << "\n";

    vector<IntercomCommunicationParameters>::const_iterator citr = m_vICP.begin();
    vector<IntercomCommunicationParameters>::const_iterator citrEnd = m_vICP.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << citr->GetAsString();
    }

    return ss.str();
}